

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void cptr_el2_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  _Bool _Var1;
  uint32_t uVar2;
  
  if ((env->features & 0x210000000) == 0x200000000) {
    _Var1 = arm_is_secure(env);
    if (!_Var1) {
      uVar2 = extract32((env->cp15).nsacr,10,1);
      if (uVar2 == 0) {
        value = value & 0xfffffffffffff3ff | (ulong)((uint)(env->cp15).cptr_el[2] & 0xc00);
      }
    }
  }
  (env->cp15).cptr_el[2] = value;
  return;
}

Assistant:

static void cptr_el2_write(CPUARMState *env, const ARMCPRegInfo *ri,
                           uint64_t value)
{
    /*
     * For A-profile AArch32 EL3, if NSACR.CP10
     * is 0 then HCPTR.{TCP11,TCP10} ignore writes and read as 1.
     */
    if (arm_feature(env, ARM_FEATURE_EL3) && !arm_el_is_aa64(env, 3) &&
        !arm_is_secure(env) && !extract32(env->cp15.nsacr, 10, 1)) {
        value &= ~(0x3 << 10);
        value |= env->cp15.cptr_el[2] & (0x3 << 10);
    }
    env->cp15.cptr_el[2] = value;
}